

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestEagerMaybeLazy::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  void *pvVar6;
  Nonnull<const_char_*> pcVar7;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) goto LAB_00c52f74;
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) == 0) goto LAB_00c52efd;
  if ((uVar1 & 1) == 0) {
LAB_00c52e9f:
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00c52f60;
      if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                            (arena,pMVar2);
        to_msg[2]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestAllTypes::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 4) == 0) {
LAB_00c52efd:
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
      uVar4 = (from_msg->_internal_metadata_).ptr_;
      if ((uVar4 & 1) == 0) {
        return;
      }
      google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
                (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8))
      ;
      return;
    }
    pMVar2 = (MessageLite *)from_msg[2]._internal_metadata_.ptr_;
    if (pMVar2 != (MessageLite *)0x0) {
      pMVar3 = (MessageLite *)to_msg[2]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestEagerMaybeLazy_NestedMessage>(arena,pMVar2);
        to_msg[2]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
      }
      else {
        TestEagerMaybeLazy_NestedMessage::MergeImpl(pMVar3,pMVar2);
      }
      goto LAB_00c52efd;
    }
  }
  else {
    pMVar2 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
    if (pMVar2 != (MessageLite *)0x0) {
      pMVar3 = (MessageLite *)to_msg[1]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           (arena,pMVar2);
        to_msg[1]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
      }
      else {
        TestAllTypes::MergeImpl(pMVar3,pMVar2);
      }
      goto LAB_00c52e9f;
    }
    MergeImpl((TestEagerMaybeLazy *)&stack0xffffffffffffffd0);
LAB_00c52f60:
    MergeImpl((TestEagerMaybeLazy *)&stack0xffffffffffffffd0);
  }
  MergeImpl((TestEagerMaybeLazy *)&stack0xffffffffffffffd0);
LAB_00c52f74:
  MergeImpl();
}

Assistant:

void TestEagerMaybeLazy::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEagerMaybeLazy*>(&to_msg);
  auto& from = static_cast<const TestEagerMaybeLazy&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestEagerMaybeLazy)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.message_foo_ != nullptr);
      if (_this->_impl_.message_foo_ == nullptr) {
        _this->_impl_.message_foo_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_foo_);
      } else {
        _this->_impl_.message_foo_->MergeFrom(*from._impl_.message_foo_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.message_bar_ != nullptr);
      if (_this->_impl_.message_bar_ == nullptr) {
        _this->_impl_.message_bar_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_bar_);
      } else {
        _this->_impl_.message_bar_->MergeFrom(*from._impl_.message_bar_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.message_baz_ != nullptr);
      if (_this->_impl_.message_baz_ == nullptr) {
        _this->_impl_.message_baz_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.message_baz_);
      } else {
        _this->_impl_.message_baz_->MergeFrom(*from._impl_.message_baz_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}